

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_cut(_glist *x)

{
  t_editor *ptVar1;
  t_selection *ptVar2;
  void *data;
  int bufsize;
  char *buf;
  int local_1c;
  char *local_18;
  
  ptVar1 = x->gl_editor;
  if (ptVar1 == (t_editor *)0x0) {
    return;
  }
  if ((ptVar1->field_0x88 & 0x20) != 0) {
    canvas_clearline(x);
    return;
  }
  if (ptVar1->e_textedfor == (_rtext *)0x0) {
    if (ptVar1->e_selection == (t_selection *)0x0) {
      return;
    }
LAB_00142ae3:
    data = canvas_undo_set_cut(x,1);
    canvas_undo_add(x,UNDO_CUT,"cut",data);
    canvas_copy(x);
    canvas_doclear(x);
    pdgui_vmess("pdtk_canvas_getscroll","c",x);
  }
  else {
    rtext_getseltext(ptVar1->e_textedfor,&local_18,&local_1c);
    if (local_1c == 0) {
      ptVar2 = x->gl_editor->e_selection;
      if ((ptVar2 != (t_selection *)0x0) && (ptVar2->sel_next == (_selection *)0x0)) {
        x->gl_editor->e_textedfor = (_rtext *)0x0;
        goto LAB_00142ae3;
      }
    }
    canvas_copy(x);
    rtext_key(x->gl_editor->e_textedfor,0x7f,&s_);
    canvas_dirty(x,1.0);
  }
  return;
}

Assistant:

static void canvas_cut(t_canvas *x)
{
    if (!x->gl_editor)  /* ignore if invisible */
        return;
    if (x->gl_editor->e_selectedline)   /* delete line */
        canvas_clearline(x);
    else if (x->gl_editor->e_textedfor) /* delete selected text in a box */
    {
        char *buf;
        int bufsize;
        rtext_getseltext(x->gl_editor->e_textedfor, &buf, &bufsize);
        if (!bufsize && x->gl_editor->e_selection &&
            !x->gl_editor->e_selection->sel_next)
        {
                /* if the text is already empty, delete the box.  We
                   first clear 'textedfor' so that canvas_doclear later will
                   think the whole box was selected, not the text */
            x->gl_editor->e_textedfor = 0;
            goto deleteobj;
        }
        canvas_copy(x);
        rtext_key(x->gl_editor->e_textedfor, 127, &s_);
        canvas_dirty(x, 1);
    }
    else if (x->gl_editor->e_selection)
    {
    deleteobj:      /* delete one or more objects */
        canvas_undo_add(x, UNDO_CUT, "cut", canvas_undo_set_cut(x, UCUT_CUT));
        canvas_copy(x);
        canvas_doclear(x);
        pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    }
}